

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateStaticInitializer
          (FileGenerator *this,Printer *p)

{
  TypeErasedState *pTVar1;
  TypeErasedState *pTVar2;
  undefined8 uVar3;
  long *plVar4;
  long lVar5;
  TypeErasedState *pTVar6;
  int priority;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  undefined8 uStack_210;
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  Printer *local_1d8;
  string local_1d0;
  FileGenerator *local_1b0;
  Printer *local_1a8;
  Sub local_1a0;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  uStack_210._4_4_ = 0;
  local_1e8._8_8_ = this->static_initializers_;
  local_1e8._0_8_ = 0x20;
  local_1d8 = p;
  local_1b0 = this;
  do {
    uStack_210._4_4_ = uStack_210._4_4_ + 1;
    if ((((vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
           *)local_1e8._8_8_)->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
           *)local_1e8._8_8_)->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1a8 = local_1d8;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"priority","");
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf2f0;
      io::Printer::Sub::Sub<int&>(&local_1a0,&local_1d0,(int *)((long)&uStack_210 + 4));
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf312;
      local_208 = &local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"expr","");
      uVar3 = local_1e8._8_8_;
      local_e8 = &local_d8;
      if (local_208 == &local_1f8) {
        uStack_d0 = uStack_1f0;
      }
      else {
        local_e8 = local_208;
      }
      _local_d8 = CONCAT71(uStack_1f7,local_1f8);
      local_e0 = local_200;
      local_200 = 0;
      local_1f8 = 0;
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf37c;
      local_208 = &local_1f8;
      local_c8 = (undefined8 *)operator_new(0x18);
      *local_c8 = uVar3;
      local_c8[1] = &local_1d8;
      *(undefined1 *)(local_c8 + 2) = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      local_c0 = 0;
      local_b8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
      local_a8 = 1;
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf407;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x361ff2);
      local_38 = 0;
      vStack_238.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u.
      _24_8_ = 0x1bf42d;
      google::protobuf::io::Printer::Emit
                (local_1a8,&local_1a0,2,0xc0,
                 "\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type\n              _static_init$priority$_ PROTOBUF_UNUSED =\n                  ($expr$, ::std::false_type{});\n        "
                );
      lVar5 = 0x170;
      do {
        if (*(char *)((long)&local_1a8 + lVar5) == '\x01') {
          vStack_238.
          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_u._24_8_ = 0x1bf448;
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_1e8 + lVar5));
        }
        if ((long *)((long)&local_200 + lVar5) != *(long **)((long)&uStack_210 + lVar5)) {
          vStack_238.
          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_u._24_8_ = 0x1bf464;
          operator_delete(*(long **)((long)&uStack_210 + lVar5),
                          *(long *)((long)&local_200 + lVar5) + 1);
        }
        vStack_238.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u
        ._24_8_ = 0x1bf477;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr
          [*(byte *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar5 + 0x20)]._M_data)
                  ((anon_class_1_0_00000001 *)((long)&uStack_210 + 3),
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&vStack_238.
                              super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                              .
                              super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      + lVar5));
        plVar4 = (long *)((long)alStack_258 + lVar5 + 0x10);
        *(undefined1 *)
         ((long)&vStack_238.
                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                 .
                 super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .
                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
         lVar5 + 0x20) = 0xff;
        if (plVar4 != *(long **)((long)alStack_258 + lVar5)) {
          vStack_238.
          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_u._24_8_ = 0x1bf497;
          operator_delete(*(long **)((long)alStack_258 + lVar5),*plVar4 + 1);
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if (local_208 != &local_1f8) {
        vStack_238.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u
        ._24_8_ = 0x1bf4b7;
        operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        vStack_238.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_u
        ._24_8_ = 0x1bf4d3;
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pTVar1 = (TypeErasedState *)
               (((_Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
                  *)uVar3)->_M_impl).super__Vector_impl_data._M_start;
      pTVar2 = (TypeErasedState *)
               (((_Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
                  *)uVar3)->_M_impl).super__Vector_impl_data._M_finish;
      pTVar6 = pTVar1;
      if (pTVar2 != pTVar1) {
        do {
          vStack_238.
          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
          .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
          _M_u._24_8_ = 0x1bf4f7;
          (**(code **)(pTVar6 + 1))(dispose,pTVar6,pTVar6);
          pTVar6 = pTVar6 + 2;
        } while (pTVar6 != pTVar2);
        (((_Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
           *)local_1e8._8_8_)->_M_impl).super__Vector_impl_data._M_finish = (pointer)pTVar1;
      }
    }
    local_1e8._8_8_ = (long)local_1b0->static_initializers_ + local_1e8._0_8_ + -8;
    local_1e8._0_8_ = local_1e8._0_8_ + 0x18;
  } while (local_1e8._0_8_ != 0x50);
  return;
}

Assistant:

void FileGenerator::GenerateStaticInitializer(io::Printer* p) {
  int priority = 0;
  for (auto& inits : static_initializers_) {
    ++priority;
    if (inits.empty()) continue;
    p->Emit(
        {{"priority", priority},
         {"expr",
          [&] {
            for (auto& init : inits) {
              init(p);
            }
          }}},
        R"cc(
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type
              _static_init$priority$_ PROTOBUF_UNUSED =
                  ($expr$, ::std::false_type{});
        )cc");
    // Reset the vector because we might be generating many files.
    inits.clear();
  }
}